

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# linux-core.c
# Opt level: O0

uint64_t uv__read_cgroups_uint64(char *cgroup,char *param)

{
  int iVar1;
  ssize_t sVar2;
  undefined1 local_168 [8];
  char buf [32];
  ssize_t n;
  char *pcStack_130;
  int fd;
  uint64_t rc;
  char filename [256];
  char *param_local;
  char *cgroup_local;
  
  snprintf((char *)&rc,0x100,"/sys/fs/cgroup/%s/%s",cgroup,param);
  pcStack_130 = (char *)0x0;
  iVar1 = uv__open_cloexec((char *)&rc,0);
  if (iVar1 < 0) {
    cgroup_local = (char *)0x0;
  }
  else {
    sVar2 = read(iVar1,local_168,0x1f);
    if (0 < sVar2) {
      local_168[sVar2] = 0;
      __isoc99_sscanf(local_168,"%lu",&stack0xfffffffffffffed0);
    }
    iVar1 = uv__close_nocheckstdio(iVar1);
    if (iVar1 != 0) {
      abort();
    }
    cgroup_local = pcStack_130;
  }
  return (uint64_t)cgroup_local;
}

Assistant:

static uint64_t uv__read_cgroups_uint64(const char* cgroup, const char* param) {
  char filename[256];
  uint64_t rc;
  int fd;
  ssize_t n;
  char buf[32];  /* Large enough to hold an encoded uint64_t. */

  snprintf(filename, 256, "/sys/fs/cgroup/%s/%s", cgroup, param);

  rc = 0;
  fd = uv__open_cloexec(filename, O_RDONLY);

  if (fd < 0)
    return 0;

  n = read(fd, buf, sizeof(buf) - 1);

  if (n > 0) {
    buf[n] = '\0';
    sscanf(buf, "%" PRIu64, &rc);
  }

  if (uv__close_nocheckstdio(fd))
    abort();

  return rc;
}